

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O2

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::PathAt(CASC_FILE_TREE *this,char *szBuffer,size_t cchBuffer,size_t nItemIndex)

{
  PCASC_FILE_NODE pFileNode;
  size_t sVar1;
  
  *szBuffer = '\0';
  pFileNode = (PCASC_FILE_NODE)CASC_ARRAY::ItemAt(&this->FileTable,nItemIndex);
  if ((pFileNode != (PCASC_FILE_NODE)0x0) && (pFileNode->NameLength != 0)) {
    sVar1 = MakePath(this,pFileNode,szBuffer,cchBuffer);
    szBuffer[sVar1] = '\0';
  }
  return pFileNode;
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::PathAt(char * szBuffer, size_t cchBuffer, size_t nItemIndex)
{
    PCASC_FILE_NODE pFileNode = NULL;
    size_t nLength;

    // Pre-set the buffer with zero
    szBuffer[0] = 0;

    // Query the item
    pFileNode = (PCASC_FILE_NODE)FileTable.ItemAt(nItemIndex);
    if(pFileNode != NULL && pFileNode->NameLength != 0)
    {
        // Construct the full path
        nLength = MakePath(pFileNode, szBuffer, cchBuffer);
        szBuffer[nLength] = 0;
    }
    
    return pFileNode;
}